

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawListFlags *pIVar2;
  ImDrawList *pIVar3;
  float *pfVar4;
  ImGuiID *pIVar5;
  ImGuiNextWindowData *pIVar6;
  ImGuiNavMoveResult *pIVar7;
  bool *pbVar8;
  ImVec2 *pIVar9;
  undefined8 uVar10;
  ImGuiID IVar11;
  ImGuiInputSource IVar12;
  ImGuiID IVar13;
  ImFontAtlas *pIVar14;
  char *pcVar15;
  uint *puVar16;
  ImGuiWindow **ppIVar17;
  ImGuiPopupData *pIVar18;
  ImGuiContext *pIVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  ImGuiContext *pIVar22;
  bool bVar23;
  bool bVar24;
  int i;
  int iVar25;
  int iVar26;
  uint *__dest;
  ImGuiWindow *pIVar27;
  ulong uVar28;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int i_1;
  uint uVar29;
  ImGuiWindow *pIVar30;
  ImGuiWindow *window;
  ImGuiWindow *parent_window_1;
  ImGuiContext *g;
  ImGuiNavMoveResult *pIVar31;
  ImRect *pIVar32;
  float *pfVar33;
  ImGuiNavLayer IVar34;
  ImFont *font;
  float *pfVar35;
  ImGuiContext *g_1;
  int n;
  long lVar36;
  ulong uVar37;
  ImGuiContext *g_5;
  byte bVar38;
  ImGuiWindow *child_window;
  bool bVar39;
  bool bVar40;
  byte bVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  ImVec2 IVar46;
  float fVar54;
  ImVec2 IVar47;
  ImVec2 IVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar52;
  double dVar51;
  undefined1 auVar53 [16];
  float fVar55;
  ImVec2 IVar56;
  ImVec2 IVar57;
  ImVec2 IVar58;
  float fVar61;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float local_68;
  ImRect local_40;
  
  bVar41 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe75,"NewFrame","ImGui ASSERT FAILED: %s",
                "GImGui != NULL && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
               );
  }
  pIVar19 = GImGui;
  if (GImGui->Initialized == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a81,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s","g.Initialized");
  }
  if (((pIVar19->IO).DeltaTime <= 0.0) && (pIVar19->FrameCount != 0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a82,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"");
  }
  if ((pIVar19->FrameCount != 0) && (pIVar19->FrameCountEnded != pIVar19->FrameCount)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a83,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
               );
  }
  if (((pIVar19->IO).DisplaySize.x < 0.0) || ((pIVar19->IO).DisplaySize.y < 0.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a84,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
               );
  }
  if ((((pIVar19->IO).Fonts)->Fonts).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a85,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
  }
  pIVar14 = (pIVar19->IO).Fonts;
  if ((pIVar14->Fonts).Size < 1) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
  }
  if ((*(pIVar14->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a86,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
               );
  }
  if ((pIVar19->Style).CurveTessellationTol <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a87,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"");
  }
  if ((pIVar19->Style).CircleSegmentMaxError <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a88,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"");
  }
  fVar43 = (pIVar19->Style).Alpha;
  if ((fVar43 < 0.0) || (1.0 < fVar43)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a89,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
               );
  }
  if (((pIVar19->Style).WindowMinSize.x < 1.0) || ((pIVar19->Style).WindowMinSize.y < 1.0)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8a,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
               );
  }
  if (2 < (pIVar19->Style).WindowMenuButtonPosition + 1U) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a8b,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
               );
  }
  lVar36 = 0;
  do {
    if (0x200 < (pIVar19->IO).KeyMap[lVar36] + 1U) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x1a8d,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                  "g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                 );
    }
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0x16);
  if ((((pIVar19->IO).ConfigFlags & 1) != 0) && ((pIVar19->IO).KeyMap[0xc] == -1)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1a91,"ErrorCheckNewFrameSanityChecks","ImGui ASSERT FAILED: %s",
                "g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
               );
  }
  if (((pIVar19->IO).ConfigWindowsResizeFromEdges == true) &&
     (((pIVar19->IO).BackendFlags & 2) == 0)) {
    (pIVar19->IO).ConfigWindowsResizeFromEdges = false;
  }
  pIVar20 = GImGui;
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Buf.Size != 0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x25e3,"UpdateSettings","ImGui ASSERT FAILED: %s","g.SettingsWindows.empty()");
    }
    pcVar15 = (pIVar20->IO).IniFilename;
    if (pcVar15 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar15);
    }
    pIVar20->SettingsLoaded = true;
  }
  if ((0.0 < pIVar20->SettingsDirtyTimer) &&
     (fVar43 = pIVar20->SettingsDirtyTimer - (pIVar20->IO).DeltaTime,
     pIVar20->SettingsDirtyTimer = fVar43, fVar43 <= 0.0)) {
    pcVar15 = (pIVar20->IO).IniFilename;
    if (pcVar15 == (char *)0x0) {
      (pIVar20->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar15);
    }
    pIVar20->SettingsDirtyTimer = 0.0;
  }
  pIVar19->Time = (double)(pIVar19->IO).DeltaTime + pIVar19->Time;
  pIVar19->WithinFrameScope = true;
  pIVar19->FrameCount = pIVar19->FrameCount + 1;
  pIVar19->TooltipOverrideCount = 0;
  pIVar19->WindowsActiveCount = 0;
  iVar26 = (pIVar19->MenusIdSubmittedThisFrame).Capacity;
  if (iVar26 < 0) {
    uVar29 = iVar26 / 2 + iVar26;
    uVar42 = 0;
    if (0 < (int)uVar29) {
      uVar42 = uVar29;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar42 * 4,GImAllocatorUserData);
    puVar16 = (pIVar19->MenusIdSubmittedThisFrame).Data;
    if (puVar16 != (uint *)0x0) {
      memcpy(__dest,puVar16,(long)(pIVar19->MenusIdSubmittedThisFrame).Size << 2);
      puVar16 = (pIVar19->MenusIdSubmittedThisFrame).Data;
      if ((puVar16 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar16,GImAllocatorUserData);
    }
    (pIVar19->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar19->MenusIdSubmittedThisFrame).Capacity = uVar42;
  }
  (pIVar19->MenusIdSubmittedThisFrame).Size = 0;
  fVar43 = (pIVar19->IO).DeltaTime;
  iVar26 = pIVar19->FramerateSecPerFrameIdx;
  pIVar19->FramerateSecPerFrameAccum =
       (fVar43 - pIVar19->FramerateSecPerFrame[iVar26]) + pIVar19->FramerateSecPerFrameAccum;
  pIVar19->FramerateSecPerFrame[iVar26] = fVar43;
  iVar25 = iVar26 + (int)((ulong)((long)(iVar26 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar19->FramerateSecPerFrameIdx = iVar26 + 1 + ((iVar25 >> 6) - (iVar25 >> 0x1f)) * -0x78;
  uVar42 = -(uint)(0.0 < pIVar19->FramerateSecPerFrameAccum);
  (pIVar19->IO).Framerate =
       (float)(~uVar42 & 0x7f7fffff |
              (uint)(1.0 / (pIVar19->FramerateSecPerFrameAccum / 120.0)) & uVar42);
  ((pIVar19->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar14 = (GImGui->IO).Fonts;
    if ((pIVar14->Fonts).Size < 1) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                  ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
    }
    font = *(pIVar14->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar19->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xe92,"NewFrame","ImGui ASSERT FAILED: %s","g.Font->IsLoaded()");
  }
  fVar43 = (pIVar19->IO).DisplaySize.x;
  fVar44 = (pIVar19->IO).DisplaySize.y;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.z = fVar43;
  (pIVar19->DrawListSharedData).ClipRectFullscreen.w = fVar44;
  fVar43 = (pIVar19->Style).CircleSegmentMaxError;
  (pIVar19->DrawListSharedData).CurveTessellationTol = (pIVar19->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError(&pIVar19->DrawListSharedData,fVar43);
  uVar42 = (uint)(pIVar19->Style).AntiAliasedLines;
  (pIVar19->DrawListSharedData).InitialFlags = uVar42;
  if (((pIVar19->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar19->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar19->DrawListSharedData).InitialFlags = uVar42 | 2;
  }
  if ((pIVar19->Style).AntiAliasedFill == true) {
    pIVar2 = &(pIVar19->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 4;
  }
  if (((pIVar19->IO).BackendFlags & 8) != 0) {
    pIVar2 = &(pIVar19->DrawListSharedData).InitialFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 8;
  }
  pIVar3 = &pIVar19->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar19->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  pIVar3 = &pIVar19->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar3);
  ImDrawList::PushTextureID(pIVar3,((pIVar19->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar3);
  (pIVar19->DrawData).Valid = false;
  (pIVar19->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar19->DrawData).CmdListsCount = 0;
  (pIVar19->DrawData).TotalIdxCount = 0;
  (pIVar19->DrawData).TotalVtxCount = 0;
  (pIVar19->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar19->DrawData).DisplayPos.y = 0;
  (pIVar19->DrawData).DisplaySize.x = 0.0;
  (pIVar19->DrawData).DisplaySize.y = 0.0;
  (pIVar19->DrawData).FramebufferScale.x = 0.0;
  pIVar20 = GImGui;
  (pIVar19->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar19->DragDropActive == true) &&
     (IVar11 = (pIVar19->DragDropPayload).SourceId, IVar11 == pIVar19->ActiveId)) {
    if (GImGui->ActiveId == IVar11) {
      GImGui->ActiveIdIsAlive = IVar11;
    }
    if (pIVar20->ActiveIdPreviousFrame == IVar11) {
      pIVar20->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar19->HoveredIdPreviousFrame == 0) {
    pIVar19->HoveredIdTimer = 0.0;
LAB_002044da:
    pIVar19->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar19->HoveredId != 0) && (pIVar19->ActiveId == pIVar19->HoveredId))
  goto LAB_002044da;
  IVar11 = pIVar19->HoveredId;
  if ((IVar11 != 0) &&
     (pIVar19->HoveredIdTimer = (pIVar19->IO).DeltaTime + pIVar19->HoveredIdTimer,
     pIVar19->ActiveId != IVar11)) {
    pIVar19->HoveredIdNotActiveTimer = (pIVar19->IO).DeltaTime + pIVar19->HoveredIdNotActiveTimer;
  }
  pIVar19->HoveredIdPreviousFrame = IVar11;
  pIVar19->HoveredId = 0;
  pIVar19->HoveredIdAllowOverlap = false;
  IVar11 = pIVar19->ActiveId;
  if (((pIVar19->ActiveIdIsAlive != IVar11) && (IVar11 != 0)) &&
     (pIVar19->ActiveIdPreviousFrame == IVar11)) {
    ClearActiveID();
  }
  IVar11 = pIVar19->ActiveId;
  if (IVar11 != 0) {
    pIVar19->ActiveIdTimer = (pIVar19->IO).DeltaTime + pIVar19->ActiveIdTimer;
  }
  pIVar19->LastActiveIdTimer = (pIVar19->IO).DeltaTime + pIVar19->LastActiveIdTimer;
  pIVar19->ActiveIdPreviousFrame = IVar11;
  pIVar19->ActiveIdPreviousFrameWindow = pIVar19->ActiveIdWindow;
  pIVar19->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar19->ActiveIdHasBeenEditedBefore;
  pIVar19->ActiveIdIsAlive = 0;
  pIVar19->ActiveIdHasBeenEditedThisFrame = false;
  pIVar19->ActiveIdPreviousFrameIsAlive = false;
  pIVar19->ActiveIdIsJustActivated = false;
  if (IVar11 != pIVar19->TempInputId && pIVar19->TempInputId != 0) {
    pIVar19->TempInputId = 0;
  }
  if (IVar11 == 0) {
    pIVar19->ActiveIdUsingNavDirMask = 0;
    pIVar19->ActiveIdUsingNavInputMask = 0;
    pIVar19->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar19->DragDropAcceptIdPrev = pIVar19->DragDropAcceptIdCurr;
  pIVar19->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar19->DragDropAcceptIdCurr = 0;
  pIVar19->DragDropWithinSource = false;
  pIVar19->DragDropWithinTarget = false;
  pIVar19->DragDropHoldJustPressedId = 0;
  pIVar20 = GImGui;
  bVar23 = (GImGui->IO).KeyCtrl;
  uVar42 = bVar23 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar42 = (uint)bVar23;
  }
  uVar29 = uVar42 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar29 = uVar42;
  }
  uVar42 = uVar29 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar42 = uVar29;
  }
  (pIVar19->IO).KeyMods = uVar42;
  pfVar4 = (pIVar19->IO).KeysDownDuration;
  memcpy((pIVar19->IO).KeysDownDurationPrev,pfVar4,0x800);
  lVar36 = 0;
  do {
    fVar43 = -1.0;
    if ((pIVar19->IO).KeysDown[lVar36] == true) {
      fVar43 = 0.0;
      if (0.0 <= pfVar4[lVar36]) {
        fVar43 = pfVar4[lVar36] + (pIVar19->IO).DeltaTime;
      }
    }
    pfVar4[lVar36] = fVar43;
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0x200);
  (pIVar20->IO).WantSetMousePos = false;
  pIVar20->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar20->NavWrapRequestFlags = 0;
  uVar42 = (pIVar20->IO).ConfigFlags;
  if ((uVar42 & 2) == 0) {
    bVar38 = 0;
  }
  else {
    bVar38 = (byte)(pIVar20->IO).BackendFlags & 1;
  }
  if ((bVar38 != 0) &&
     (((0.0 < (pIVar20->IO).NavInputs[0] || (0.0 < (pIVar20->IO).NavInputs[2])) ||
      ((0.0 < (pIVar20->IO).NavInputs[1] || (0.0 < (pIVar20->IO).NavInputs[3])))))) {
    pIVar20->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar42 & 1) != 0) {
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[0xc]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[0] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[0xd]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[2] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[0xe]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[1] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[1]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[0x11] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[2]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[0x12] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[3]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[0x13] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = IsKeyDown((pIVar20->IO).KeyMap[4]);
    if (bVar23) {
      (pIVar20->IO).NavInputs[0x14] = 1.0;
      pIVar20->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar23 = (pIVar20->IO).KeyCtrl;
    if (bVar23 == true) {
      (pIVar20->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar20->IO).KeyShift == true) {
      (pIVar20->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar23 == false) && ((pIVar20->IO).KeyAlt != false)) {
      (pIVar20->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar4 = (pIVar20->IO).NavInputsDownDuration;
  pfVar33 = pfVar4;
  pfVar35 = (pIVar20->IO).NavInputsDownDurationPrev;
  for (lVar36 = 0x15; lVar36 != 0; lVar36 = lVar36 + -1) {
    *pfVar35 = *pfVar33;
    pfVar33 = pfVar33 + (ulong)bVar41 * -2 + 1;
    pfVar35 = pfVar35 + (ulong)bVar41 * -2 + 1;
  }
  lVar36 = 0;
  do {
    fVar43 = -1.0;
    if (0.0 < (pIVar20->IO).NavInputs[lVar36]) {
      fVar43 = 0.0;
      if (0.0 <= pfVar4[lVar36]) {
        fVar43 = pfVar4[lVar36] + (pIVar20->IO).DeltaTime;
      }
    }
    pfVar4[lVar36] = fVar43;
    pIVar21 = GImGui;
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0x15);
  IVar11 = pIVar20->NavInitResultId;
  if ((IVar11 != 0) &&
     (((pIVar20->NavDisableHighlight != true || (pIVar20->NavInitRequestFromMove == true)) &&
      (pIVar20->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar34 = pIVar20->NavLayer;
    if (pIVar20->NavInitRequestFromMove == true) {
      SetNavID(IVar11,IVar34,0);
      IVar46 = (pIVar20->NavInitResultRectRel).Max;
      pIVar9 = &pIVar21->NavWindow->NavRectRel[(int)IVar34].Min;
      *pIVar9 = (pIVar20->NavInitResultRectRel).Min;
      pIVar9[1] = IVar46;
      pIVar21->NavMousePosDirty = true;
      pIVar21->NavDisableHighlight = false;
      pIVar21->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar11,IVar34,0);
    }
    IVar46 = (pIVar20->NavInitResultRectRel).Max;
    pIVar9 = &pIVar20->NavWindow->NavRectRel[pIVar20->NavLayer].Min;
    *pIVar9 = (pIVar20->NavInitResultRectRel).Min;
    pIVar9[1] = IVar46;
  }
  pIVar20->NavInitRequest = false;
  pIVar20->NavInitRequestFromMove = false;
  pIVar20->NavInitResultId = 0;
  pIVar20->NavJustMovedToId = 0;
  pIVar21 = GImGui;
  if (pIVar20->NavMoveRequest == true) {
    IVar11 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar11 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar21->NavDisableHighlight = false;
        pIVar21->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar7 = &GImGui->NavMoveResultOther;
      pIVar31 = &GImGui->NavMoveResultLocal;
      if (IVar11 == 0) {
        pIVar31 = pIVar7;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar11 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar11 != 0)) &&
         (IVar11 != GImGui->NavId)) {
        pIVar31 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar31 != pIVar7) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar43 = (GImGui->NavMoveResultOther).DistBox;
        fVar44 = pIVar31->DistBox;
        if (fVar44 <= fVar43) {
          if (((fVar43 != fVar44) || (NAN(fVar43) || NAN(fVar44))) ||
             (pfVar4 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar31->DistCenter < *pfVar4 || pIVar31->DistCenter == *pfVar4)) goto LAB_00204a7b;
        }
        pIVar31 = pIVar7;
      }
LAB_00204a7b:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar31->Window == (ImGuiWindow *)0x0)) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                    ,0x2248,"NavUpdateMoveResult","ImGui ASSERT FAILED: %s",
                    "g.NavWindow && result->Window");
      }
      if (pIVar21->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar21->NavMoveRequestFlags & 0x40) == 0) {
          IVar46 = pIVar31->Window->Pos;
          IVar56 = (pIVar31->RectRel).Min;
          fVar43 = IVar46.x;
          local_40.Min.x = IVar56.x + fVar43;
          fVar44 = IVar46.y;
          local_40.Min.y = IVar56.y + fVar44;
          IVar46 = (pIVar31->RectRel).Max;
          local_40.Max.x = IVar46.x + fVar43;
          local_40.Max.y = IVar46.y + fVar44;
          IVar46 = ScrollToBringRectIntoView(pIVar31->Window,&local_40);
        }
        else {
          fVar43 = 0.0;
          if (pIVar21->NavMoveDir == 2) {
            fVar43 = (pIVar31->Window->ScrollMax).y;
          }
          pIVar27 = pIVar31->Window;
          IVar46 = (ImVec2)((ulong)(uint)((pIVar27->Scroll).y - fVar43) << 0x20);
          (pIVar27->ScrollTarget).y = fVar43;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar43 = (pIVar31->RectRel).Min.y;
        fVar44 = (pIVar31->RectRel).Max.x;
        fVar45 = (pIVar31->RectRel).Max.y;
        (pIVar31->RectRel).Min.x = (pIVar31->RectRel).Min.x - IVar46.x;
        (pIVar31->RectRel).Min.y = fVar43 - IVar46.y;
        (pIVar31->RectRel).Max.x = fVar44 - IVar46.x;
        (pIVar31->RectRel).Max.y = fVar45 - IVar46.y;
      }
      ClearActiveID();
      pIVar21->NavWindow = pIVar31->Window;
      IVar11 = pIVar31->ID;
      if (pIVar21->NavId != IVar11) {
        pIVar21->NavJustMovedToId = IVar11;
        pIVar21->NavJustMovedToFocusScopeId = pIVar31->FocusScopeId;
        pIVar21->NavJustMovedToKeyMods = pIVar21->NavMoveRequestKeyMods;
      }
      pIVar22 = GImGui;
      IVar34 = pIVar21->NavLayer;
      SetNavID(IVar11,IVar34,pIVar31->FocusScopeId);
      IVar46 = (pIVar31->RectRel).Max;
      pIVar9 = &pIVar22->NavWindow->NavRectRel[(int)IVar34].Min;
      *pIVar9 = (pIVar31->RectRel).Min;
      pIVar9[1] = IVar46;
      pIVar22->NavMousePosDirty = true;
      pIVar22->NavDisableHighlight = false;
      pIVar22->NavDisableMouseHover = true;
      pIVar21->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar20->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar20->NavMoveRequest == false) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x2152,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavMoveRequest");
    }
    if (((pIVar20->NavMoveResultLocal).ID == 0) && ((pIVar20->NavMoveResultOther).ID == 0)) {
      pIVar20->NavDisableHighlight = false;
    }
    pIVar20->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar20->NavMousePosDirty == true) && (pIVar20->NavIdIsAlive == true)) {
    if ((((pIVar20->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar20->IO).BackendFlags & 4) != 0 && (pIVar20->NavDisableHighlight == false)) &&
         (pIVar20->NavDisableMouseHover == true)) && (pIVar20->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar46 = NavCalcPreferredRefPos();
      (pIVar20->IO).MousePosPrev = IVar46;
      (pIVar20->IO).MousePos = IVar46;
      (pIVar20->IO).WantSetMousePos = true;
    }
    pIVar20->NavMousePosDirty = false;
  }
  pIVar20->NavIdIsAlive = false;
  pIVar20->NavJustTabbedId = 0;
  if (ImGuiNavLayer_Menu < pIVar20->NavLayer) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2168,"NavUpdate","ImGui ASSERT FAILED: %s","g.NavLayer == 0 || g.NavLayer == 1");
  }
  pIVar27 = pIVar20->NavWindow;
  pIVar30 = pIVar27;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar30->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar30 != pIVar27) {
          pIVar30->NavLastChildNavWindow = pIVar27;
        }
        break;
      }
      ppIVar17 = &pIVar30->ParentWindow;
      pIVar30 = *ppIVar17;
    } while (*ppIVar17 != (ImGuiWindow *)0x0);
    if (((pIVar27 != (ImGuiWindow *)0x0) && (pIVar27->NavLastChildNavWindow != (ImGuiWindow *)0x0))
       && (pIVar20->NavLayer == ImGuiNavLayer_Main)) {
      pIVar27->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar21 = GImGui;
  pIVar27 = GetTopMostPopupModal();
  if (pIVar27 == (ImGuiWindow *)0x0) {
    if ((pIVar21->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar43 = (pIVar21->IO).DeltaTime * -10.0 + pIVar21->NavWindowingHighlightAlpha;
      fVar43 = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
      pIVar21->NavWindowingHighlightAlpha = fVar43;
      if ((pIVar21->DimBgRatio <= 0.0) && (fVar43 <= 0.0)) {
        pIVar21->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar23 = (pIVar21->IO).NavInputsDownDuration[3] == 0.0;
      if ((((pIVar21->IO).KeyCtrl != true) || (iVar26 = (pIVar21->IO).KeyMap[0], iVar26 < 0)) ||
         (bVar40 = IsKeyPressed(iVar26,true), !bVar40)) goto LAB_00204e25;
      bVar41 = (byte)(pIVar21->IO).ConfigFlags & 1;
    }
    else {
      bVar23 = false;
LAB_00204e25:
      bVar41 = 0;
    }
    if (bVar23 || bVar41 != 0) {
      pIVar27 = pIVar21->NavWindow;
      if (pIVar27 == (ImGuiWindow *)0x0) {
        pIVar27 = FindWindowNavFocusable((pIVar21->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar27 != (ImGuiWindow *)0x0) {
        pIVar27 = pIVar27->RootWindow;
        pIVar21->NavWindowingTargetAnim = pIVar27;
        pIVar21->NavWindowingTarget = pIVar27;
        pIVar21->NavWindowingTimer = 0.0;
        pIVar21->NavWindowingHighlightAlpha = 0.0;
        pIVar21->NavWindowingToggleLayer = (bool)(bVar41 ^ 1);
        pIVar21->NavInputSource = ImGuiInputSource_NavGamepad - bVar41;
      }
    }
    fVar43 = (pIVar21->IO).DeltaTime + pIVar21->NavWindowingTimer;
    pIVar21->NavWindowingTimer = fVar43;
    if ((pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar21->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_00204f8c:
      bVar23 = false;
      pIVar27 = (ImGuiWindow *)0x0;
    }
    else {
      fVar44 = (fVar43 + -0.2) / 0.05;
      fVar43 = 1.0;
      if (fVar44 <= 1.0) {
        fVar43 = fVar44;
      }
      fVar43 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar43);
      uVar29 = -(uint)(fVar43 <= pIVar21->NavWindowingHighlightAlpha);
      pIVar21->NavWindowingHighlightAlpha =
           (float)(uVar29 & (uint)pIVar21->NavWindowingHighlightAlpha | ~uVar29 & (uint)fVar43);
      fVar43 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar44 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar26 = (uint)(0.0 < fVar43) - (uint)(0.0 < fVar44);
      if (iVar26 != 0) {
        NavUpdateWindowingHighlightWindow(iVar26);
        pIVar21->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00204f8c;
      pbVar8 = &pIVar21->NavWindowingToggleLayer;
      *pbVar8 = (bool)(*pbVar8 &
                      (pIVar21->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar21->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar8 == false) {
        pIVar27 = pIVar21->NavWindowingTarget;
        bVar23 = false;
      }
      else {
        bVar23 = pIVar21->NavWindow != (ImGuiWindow *)0x0;
        pIVar27 = (ImGuiWindow *)0x0;
      }
      pIVar21->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar21->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar21->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar44 = (pIVar21->NavWindowingTimer + -0.2) / 0.05;
      fVar43 = 1.0;
      if (fVar44 <= 1.0) {
        fVar43 = fVar44;
      }
      fVar43 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar43);
      uVar29 = -(uint)(fVar43 <= pIVar21->NavWindowingHighlightAlpha);
      pIVar21->NavWindowingHighlightAlpha =
           (float)(uVar29 & (uint)pIVar21->NavWindowingHighlightAlpha | ~uVar29 & (uint)fVar43);
      iVar26 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar26) && (bVar40 = IsKeyPressed(iVar26,true), bVar40)) {
        NavUpdateWindowingHighlightWindow((pIVar21->IO).KeyShift - 1 | 1);
      }
      if ((pIVar21->IO).KeyCtrl == false) {
        pIVar27 = pIVar21->NavWindowingTarget;
      }
    }
    pIVar22 = GImGui;
    fVar43 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar43 == 0.0) && (!NAN(fVar43))) {
      pIVar21->NavWindowingToggleLayer = true;
    }
    bVar40 = bVar23;
    if ((((pIVar21->ActiveId == 0) || (pIVar21->ActiveIdAllowOverlap == true)) && (fVar43 < 0.0)) &&
       ((pIVar21->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar22->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar39 = IsMousePosValid(&(pIVar21->IO).MousePos);
      bVar24 = IsMousePosValid(&(pIVar21->IO).MousePosPrev);
      bVar40 = true;
      if (bVar24 != bVar39) {
        bVar40 = bVar23;
      }
    }
    pIVar30 = pIVar21->NavWindowingTarget;
    if ((pIVar30 != (ImGuiWindow *)0x0) && ((pIVar30->Flags & 4) == 0)) {
      IVar12 = pIVar21->NavInputSource;
      IVar46.x = 0.0;
      IVar46.y = 0.0;
      if ((IVar12 == ImGuiInputSource_NavKeyboard) && ((pIVar21->IO).KeyShift == false)) {
        IVar46 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar12 == ImGuiInputSource_NavGamepad) {
        IVar46 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar43 = IVar46.y;
      if (((IVar46.x != 0.0) || (fVar43 != 0.0)) || (NAN(fVar43))) {
        fVar44 = (pIVar21->IO).DisplayFramebufferScale.x;
        fVar45 = (pIVar21->IO).DisplayFramebufferScale.y;
        if (fVar45 <= fVar44) {
          fVar44 = fVar45;
        }
        fVar44 = (float)(int)(fVar44 * (pIVar21->IO).DeltaTime * 800.0);
        IVar56 = pIVar30->RootWindow->Pos;
        local_40.Min.x = IVar56.x + IVar46.x * fVar44;
        local_40.Min.y = IVar56.y + fVar43 * fVar44;
        SetWindowPos(pIVar30->RootWindow,&local_40.Min,1);
        pIVar21->NavDisableMouseHover = true;
        if (((pIVar21->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar27 != (ImGuiWindow *)0x0) {
      if ((pIVar21->NavWindow == (ImGuiWindow *)0x0) || (pIVar27 != pIVar21->NavWindow->RootWindow))
      {
        ClearActiveID();
        pIVar21->NavDisableHighlight = false;
        pIVar21->NavDisableMouseHover = true;
        pIVar30 = pIVar27->NavLastChildNavWindow;
        if (pIVar27->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar30 = pIVar27;
        }
        ClosePopupsOverWindow(pIVar30,false);
        FocusWindow(pIVar30);
        if (pIVar30->NavLastIds[0] == 0) {
          NavInitWindow(pIVar30,false);
        }
        if ((pIVar30->DC).NavLayerActiveMask == 2) {
          pIVar21->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar21->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar40) && (pIVar27 = pIVar21->NavWindow, pIVar30 = pIVar27, pIVar27 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar30, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar30 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar27) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar27;
      }
      pIVar21->NavDisableHighlight = false;
      pIVar21->NavDisableMouseHover = true;
      IVar34 = ImGuiNavLayer_Main;
      if (((pIVar21->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar34 = pIVar21->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar34);
    }
  }
  else {
    pIVar21->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar42 & 1) == 0 & (bVar38 ^ 1)) == 0) && (pIVar20->NavWindow != (ImGuiWindow *)0x0)) {
    bVar23 = (pIVar20->NavWindow->Flags & 0x40000U) == 0;
    (pIVar20->IO).NavActive = bVar23;
    if (((!bVar23) || (pIVar20->NavId == 0)) ||
       (bVar23 = true, pIVar20->NavDisableHighlight != false)) goto LAB_00205334;
  }
  else {
    (pIVar20->IO).NavActive = false;
LAB_00205334:
    bVar23 = pIVar20->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar20->IO).NavVisible = bVar23;
  fVar43 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar43 == 0.0) && (!NAN(fVar43))) {
    if (pIVar20->ActiveId == 0) {
      pIVar27 = pIVar20->NavWindow;
      if (((pIVar27 == (ImGuiWindow *)0x0) || ((pIVar27->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar30 = pIVar27->ParentWindow, pIVar30 == (ImGuiWindow *)0x0)) {
        iVar26 = (pIVar20->OpenPopupStack).Size;
        if ((long)iVar26 < 1) {
          if (pIVar20->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x5000000U) != 0x1000000)) {
              pIVar27->NavLastIds[0] = 0;
            }
            pIVar20->NavId = 0;
            pIVar20->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar20->OpenPopupStack).Data[(long)iVar26 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar26 + -1,true);
        }
      }
      else {
        if (pIVar27->ChildId == 0) {
          LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                      ,0x2184,"NavUpdate","ImGui ASSERT FAILED: %s","child_window->ChildId != 0");
        }
        FocusWindow(pIVar30);
        SetNavID(pIVar27->ChildId,0,0);
        pIVar20->NavIdIsAlive = false;
        if (pIVar20->NavDisableMouseHover == true) {
          pIVar20->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar5 = &pIVar20->NavActivateId;
  pIVar20->NavActivateId = 0;
  pIVar20->NavActivateDownId = 0;
  pIVar20->NavActivatePressedId = 0;
  pIVar21 = GImGui;
  pIVar20->NavInputId = 0;
  IVar11 = pIVar20->NavId;
  if ((((IVar11 != 0) && (pIVar20->NavDisableHighlight == false)) &&
      (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar20->NavWindow != (ImGuiWindow *)0x0 && ((pIVar20->NavWindow->Flags & 0x40000) == 0)))) {
    fVar43 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar43) {
      bVar23 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar23 = false;
    }
    IVar13 = pIVar20->ActiveId;
    if (bVar23 && IVar13 == 0) {
      *pIVar5 = IVar11;
    }
    if (IVar13 == 0) {
      if (0.0 < fVar43) goto LAB_00206aec;
    }
    else if (IVar13 == IVar11 && 0.0 < fVar43) {
LAB_00206aec:
      pIVar20->NavActivateDownId = IVar11;
    }
    if (IVar13 == 0) {
      if (bVar23) goto LAB_00206b02;
    }
    else if ((bool)(bVar23 & IVar13 == IVar11)) {
LAB_00206b02:
      pIVar20->NavActivatePressedId = IVar11;
    }
    if (((IVar13 == 0 || IVar13 == IVar11) &&
        (fVar43 = (pIVar21->IO).NavInputsDownDuration[2], fVar43 == 0.0)) && (!NAN(fVar43))) {
      pIVar20->NavInputId = IVar11;
    }
  }
  if ((pIVar20->NavWindow != (ImGuiWindow *)0x0) && ((pIVar20->NavWindow->Flags & 0x40000) != 0)) {
    pIVar20->NavDisableHighlight = true;
  }
  if ((*pIVar5 != 0) && (pIVar20->NavActivateDownId != *pIVar5)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x21b2,"NavUpdate","ImGui ASSERT FAILED: %s",
                "g.NavActivateDownId == g.NavActivateId");
  }
  pIVar20->NavMoveRequest = false;
  IVar11 = pIVar20->NavNextActivateId;
  if (IVar11 != 0) {
    *pIVar5 = IVar11;
    pIVar20->NavActivateDownId = IVar11;
    pIVar20->NavActivatePressedId = IVar11;
    pIVar20->NavInputId = IVar11;
  }
  pIVar20->NavNextActivateId = 0;
  if (pIVar20->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar20->NavMoveDir = -1;
    pIVar20->NavMoveRequestFlags = 0;
    if (((pIVar20->NavWindow != (ImGuiWindow *)0x0) &&
        (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar20->NavWindow->Flags & 0x40000) == 0)) {
      uVar29 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar29 & 1) == 0) &&
         ((fVar43 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar20->NavMoveDir = 0;
      }
      if (((uVar29 & 2) == 0) &&
         ((fVar43 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar20->NavMoveDir = 1;
      }
      if (((uVar29 & 4) == 0) &&
         ((fVar43 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar20->NavMoveDir = 2;
      }
      if (((uVar29 & 8) == 0) &&
         ((fVar43 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar43 ||
          (fVar43 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar43)))) {
        pIVar20->NavMoveDir = 3;
      }
    }
    pIVar20->NavMoveClipDir = pIVar20->NavMoveDir;
  }
  else {
    if ((pIVar20->NavMoveDir == -1) || (pIVar20->NavMoveClipDir == -1)) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21cd,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None");
    }
    if (pIVar20->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x21ce,"NavUpdate","ImGui ASSERT FAILED: %s",
                  "g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued");
    }
    pIVar20->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar21 = GImGui;
  fVar43 = 0.0;
  if (((((uVar42 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar27 = GImGui->NavWindow, pIVar27 != (ImGuiWindow *)0x0)) &&
     ((((pIVar27->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar23 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar40 = false;
    bVar39 = false;
    if (bVar23) {
      bVar39 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar23 = IsKeyDown((pIVar21->IO).KeyMap[6]);
    if (bVar23) {
      bVar40 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar23 = IsKeyPressed((pIVar21->IO).KeyMap[7],true);
    if (bVar23) {
      bVar23 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar23 = false;
    }
    bVar24 = IsKeyPressed((pIVar21->IO).KeyMap[8],true);
    if (bVar24) {
      bVar24 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar24 = false;
    }
    fVar43 = 0.0;
    if ((bVar39 != bVar40) || (bVar23 != bVar24)) {
      if (((pIVar27->DC).NavLayerActiveMask == 0) && ((pIVar27->DC).NavHasScroll == true)) {
        bVar40 = IsKeyPressed((pIVar21->IO).KeyMap[5],true);
        if (bVar40) {
          (pIVar27->ScrollTarget).y =
               (pIVar27->Scroll).y - ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y);
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar40 = IsKeyPressed((pIVar21->IO).KeyMap[6],true);
          if (bVar40) {
            fVar43 = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) + (pIVar27->Scroll).y
            ;
LAB_00206db2:
            (pIVar27->ScrollTarget).y = fVar43;
            (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          }
          else if (bVar23 == false) {
            if (bVar24 != false) {
              fVar43 = (pIVar27->ScrollMax).y;
              goto LAB_00206db2;
            }
          }
          else {
            (pIVar27->ScrollTarget).y = 0.0;
            (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          }
        }
        fVar43 = 0.0;
      }
      else {
        IVar34 = pIVar21->NavLayer;
        pIVar32 = pIVar27->NavRectRel + IVar34;
        fVar43 = GImGui->FontBaseSize * pIVar27->FontWindowScale;
        if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
          fVar43 = fVar43 * pIVar27->ParentWindow->FontWindowScale;
        }
        fVar43 = (pIVar27->NavRectRel[IVar34].Max.y - pIVar27->NavRectRel[IVar34].Min.y) +
                 (((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) - fVar43);
        fVar43 = (float)(~-(uint)(fVar43 <= 0.0) & (uint)fVar43);
        bVar40 = IsKeyPressed((pIVar21->IO).KeyMap[5],true);
        if (bVar40) {
          fVar43 = -fVar43;
          pIVar21->NavMoveDir = 3;
          pIVar21->NavMoveClipDir = 2;
          pIVar21->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar40 = IsKeyPressed((pIVar21->IO).KeyMap[6],true);
          if (bVar40) {
            pIVar21->NavMoveDir = 2;
            pIVar21->NavMoveClipDir = 3;
            pIVar21->NavMoveRequestFlags = 0x30;
          }
          else if (bVar23 == false) {
            fVar43 = 0.0;
            if (bVar24 != false) {
              fVar44 = ((pIVar27->ScrollMax).y + (pIVar27->SizeFull).y) - (pIVar27->Scroll).y;
              pIVar27->NavRectRel[IVar34].Max.y = fVar44;
              pIVar27->NavRectRel[IVar34].Min.y = fVar44;
              fVar44 = (pIVar32->Min).x;
              pIVar9 = &pIVar27->NavRectRel[IVar34].Max;
              if (pIVar9->x <= fVar44 && fVar44 != pIVar9->x) {
                pIVar27->NavRectRel[IVar34].Max.x = 0.0;
                (pIVar32->Min).x = 0.0;
              }
              pIVar21->NavMoveDir = 2;
              pIVar21->NavMoveRequestFlags = 0x50;
            }
          }
          else {
            fVar43 = -(pIVar27->Scroll).y;
            pIVar27->NavRectRel[IVar34].Max.y = fVar43;
            pIVar27->NavRectRel[IVar34].Min.y = fVar43;
            fVar43 = (pIVar32->Min).x;
            pIVar9 = &pIVar27->NavRectRel[IVar34].Max;
            if (pIVar9->x <= fVar43 && fVar43 != pIVar9->x) {
              pIVar27->NavRectRel[IVar34].Max.x = 0.0;
              (pIVar32->Min).x = 0.0;
            }
            pIVar21->NavMoveDir = 3;
            pIVar21->NavMoveRequestFlags = 0x50;
            fVar43 = 0.0;
          }
        }
      }
    }
  }
  if (pIVar20->NavMoveDir != -1) {
    pIVar20->NavMoveRequest = true;
    pIVar20->NavMoveRequestKeyMods = (pIVar20->IO).KeyMods;
    pIVar20->NavMoveDirLast = pIVar20->NavMoveDir;
  }
  if ((pIVar20->NavMoveRequest == true) && (pIVar20->NavId == 0)) {
    pIVar20->NavInitRequest = true;
    pIVar20->NavInitRequestFromMove = true;
    pIVar20->NavInitResultId = 0;
    pIVar20->NavDisableHighlight = false;
  }
  pIVar21 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar8 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar8;
    if (*pbVar8 != false) goto LAB_0020582f;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0020582f:
    if (pIVar21->NavWindow == (ImGuiWindow *)0x0) {
      LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                  ,0x20ba,"NavUpdateAnyRequestFlag","ImGui ASSERT FAILED: %s","g.NavWindow != NULL")
      ;
    }
  }
  pIVar27 = pIVar20->NavWindow;
  if (((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) == 0)) &&
     (pIVar20->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar44 = GImGui->FontBaseSize * pIVar27->FontWindowScale;
    if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
      fVar44 = fVar44 * pIVar27->ParentWindow->FontWindowScale;
    }
    fVar44 = (float)(int)(fVar44 * 100.0 * (pIVar20->IO).DeltaTime + 0.5);
    if ((((pIVar27->DC).NavLayerActiveMask == 0) && ((pIVar27->DC).NavHasScroll == true)) &&
       (pIVar20->NavMoveRequest == true)) {
      uVar42 = pIVar20->NavMoveDir;
      if (uVar42 < 2) {
        (pIVar27->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_0027e588 + (ulong)(uVar42 == 0) * 4) * fVar44 +
                         (pIVar27->Scroll).x);
        (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar42 & 0xfffffffe) == 2) {
        (pIVar27->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_0027e588 + (ulong)(uVar42 == 2) * 4) * fVar44 +
                         (pIVar27->Scroll).y);
        (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar46 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar45 = IVar46.x;
    fVar54 = IVar46.y;
    if (((fVar45 != 0.0) || (NAN(fVar45))) && (pIVar27->ScrollbarX == true)) {
      (pIVar27->ScrollTarget).x = (float)(int)(fVar45 * fVar44 + (pIVar27->Scroll).x);
      (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      pIVar20->NavMoveFromClampedRefRect = true;
    }
    if ((fVar54 != 0.0) || (NAN(fVar54))) {
      (pIVar27->ScrollTarget).y = (float)(int)(fVar54 * fVar44 + (pIVar27->Scroll).y);
      (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      pIVar20->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar20->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar20->NavMoveResultLocal).ID = 0;
  (pIVar20->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar20->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar20->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar20->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar20->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar20->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar20->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar20->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar20->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar20->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar20->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar20->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar20->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar20->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar20->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar20->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar20->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar20->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar20->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar20->NavMoveResultOther).ID = 0;
  (pIVar20->NavMoveResultOther).FocusScopeId = 0;
  (pIVar20->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar20->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar20->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar20->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar20->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar20->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar20->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((pIVar20->NavMoveRequest == true) && (pIVar20->NavMoveFromClampedRefRect == true)) &&
     (pIVar20->NavLayer == ImGuiNavLayer_Main)) {
    IVar46 = (pIVar27->InnerRect).Min;
    fVar44 = (pIVar27->Pos).x;
    fVar54 = (pIVar27->Pos).y;
    fVar55 = (IVar46.x - fVar44) + -1.0;
    fVar61 = (IVar46.y - fVar54) + -1.0;
    IVar46 = (pIVar27->InnerRect).Max;
    fVar45 = (IVar46.x - fVar44) + 1.0;
    fVar54 = (IVar46.y - fVar54) + 1.0;
    fVar44 = pIVar27->NavRectRel[0].Min.x;
    if (((fVar44 < fVar55) || (pIVar27->NavRectRel[0].Min.y < fVar61)) ||
       ((fVar45 < pIVar27->NavRectRel[0].Max.x || (fVar54 < pIVar27->NavRectRel[0].Max.y)))) {
      fVar64 = GImGui->FontBaseSize * pIVar27->FontWindowScale;
      if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
        fVar64 = fVar64 * pIVar27->ParentWindow->FontWindowScale;
      }
      auVar65._0_4_ = fVar64 * 0.5;
      auVar66._0_4_ = fVar45 - fVar55;
      auVar66._4_4_ = fVar54 - fVar61;
      auVar66._8_8_ = 0;
      auVar65._4_4_ = auVar65._0_4_;
      auVar65._8_4_ = auVar65._0_4_;
      auVar65._12_4_ = auVar65._0_4_;
      auVar67 = minps(auVar66,auVar65);
      fVar55 = fVar55 + auVar67._0_4_;
      fVar61 = fVar61 + auVar67._4_4_;
      fVar64 = pIVar27->NavRectRel[0].Min.y;
      uVar42 = -(uint)(fVar55 <= fVar44);
      uVar29 = -(uint)(fVar61 <= fVar64);
      auVar59._0_4_ = fVar45 - auVar67._0_4_;
      auVar59._4_4_ = fVar54 - auVar67._4_4_;
      auVar59._8_4_ = 0.0 - auVar67._8_4_;
      auVar59._12_4_ = 0.0 - auVar67._12_4_;
      auVar67._8_8_ = 0;
      auVar67._0_4_ = pIVar27->NavRectRel[0].Max.x;
      auVar67._4_4_ = pIVar27->NavRectRel[0].Max.y;
      auVar59 = minps(auVar67,auVar59);
      pIVar27->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar29 & (uint)fVar61,~uVar42 & (uint)fVar55) |
                   CONCAT44((uint)fVar64 & uVar29,(uint)fVar44 & uVar42));
      pIVar27->NavRectRel[0].Max = auVar59._0_8_;
      pIVar20->NavId = 0;
      pIVar20->NavFocusScopeId = 0;
    }
    pIVar20->NavMoveFromClampedRefRect = false;
  }
  pIVar27 = pIVar20->NavWindow;
  if (pIVar27 == (ImGuiWindow *)0x0) {
LAB_00205bbf:
    IVar47.x = 0.0;
    IVar47.y = 0.0;
    IVar56.x = 0.0;
    IVar56.y = 0.0;
  }
  else {
    IVar56 = pIVar27->NavRectRel[pIVar20->NavLayer].Min;
    IVar47 = pIVar27->NavRectRel[pIVar20->NavLayer].Max;
    if ((IVar47.x < IVar56.x) || (IVar47.y < IVar56.y)) goto LAB_00205bbf;
  }
  if (pIVar27 == (ImGuiWindow *)0x0) {
    IVar48 = (GImGui->IO).DisplaySize;
    IVar57.x = 0.0;
    IVar57.y = 0.0;
  }
  else {
    fVar44 = (pIVar27->Pos).x;
    IVar57.x = IVar56.x + fVar44;
    fVar45 = (pIVar27->Pos).y;
    IVar57.y = IVar56.y + fVar45;
    IVar48.x = IVar47.x + fVar44;
    IVar48.y = IVar47.y + fVar45;
  }
  (pIVar20->NavScoringRect).Min = IVar57;
  (pIVar20->NavScoringRect).Max = IVar48;
  fVar54 = (pIVar20->NavScoringRect).Min.y + fVar43;
  (pIVar20->NavScoringRect).Min.y = fVar54;
  fVar43 = fVar43 + (pIVar20->NavScoringRect).Max.y;
  (pIVar20->NavScoringRect).Max.y = fVar43;
  fVar45 = (pIVar20->NavScoringRect).Min.x + 1.0;
  fVar44 = (pIVar20->NavScoringRect).Max.x;
  if (fVar44 <= fVar45) {
    fVar45 = fVar44;
  }
  (pIVar20->NavScoringRect).Min.x = fVar45;
  (pIVar20->NavScoringRect).Max.x = fVar45;
  if (fVar43 < fVar54) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x2220,"NavUpdate","ImGui ASSERT FAILED: %s","!g.NavScoringRect.IsInverted()");
  }
  pIVar20->NavScoringCount = 0;
  pIVar20 = GImGui;
  pIVar9 = &(GImGui->IO).MousePos;
  bVar23 = IsMousePosValid(pIVar9);
  if (bVar23) {
    IVar46 = (pIVar20->IO).MousePos;
    IVar49.x = (float)(int)IVar46.x;
    IVar49.y = (float)(int)IVar46.y;
    pIVar20->LastValidMousePos = IVar49;
    (pIVar20->IO).MousePos = IVar49;
  }
  bVar23 = IsMousePosValid(pIVar9);
  if ((bVar23) && (bVar23 = IsMousePosValid(&(pIVar20->IO).MousePosPrev), bVar23)) {
    IVar46 = (pIVar20->IO).MousePos;
    IVar56 = (pIVar20->IO).MousePosPrev;
    IVar50.x = IVar46.x - IVar56.x;
    IVar50.y = IVar46.y - IVar56.y;
    (pIVar20->IO).MouseDelta = IVar50;
  }
  else {
    (pIVar20->IO).MouseDelta.x = 0.0;
    (pIVar20->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar20->IO).MouseDelta.x != 0.0) || (fVar43 = (pIVar20->IO).MouseDelta.y, fVar43 != 0.0))
     || (NAN(fVar43))) {
    pIVar20->NavDisableMouseHover = false;
  }
  (pIVar20->IO).MousePosPrev = (pIVar20->IO).MousePos;
  lVar36 = -5;
  do {
    fVar43 = -1.0;
    bVar23 = (pIVar20->IO).MouseDown[lVar36 + 5];
    if (bVar23 == true) {
      pfVar4 = (pIVar20->IO).MouseDownDurationPrev + lVar36;
      bVar40 = *pfVar4 <= 0.0 && *pfVar4 != 0.0;
    }
    else {
      bVar40 = false;
    }
    (pIVar20->IO).MouseDoubleClicked[lVar36] = bVar40;
    if (bVar23 == false) {
      bVar39 = 0.0 <= (pIVar20->IO).MouseDownDurationPrev[lVar36];
    }
    else {
      bVar39 = false;
    }
    (pIVar20->IO).MouseDownOwned[lVar36] = bVar39;
    fVar44 = (pIVar20->IO).MouseDownDurationPrev[lVar36];
    (&(pIVar20->IO).MouseDragMaxDistanceAbs[0].x)[lVar36] = fVar44;
    if ((bVar23 != false) && (fVar43 = 0.0, 0.0 <= fVar44)) {
      fVar43 = fVar44 + (pIVar20->IO).DeltaTime;
    }
    (pIVar20->IO).MouseDownDurationPrev[lVar36] = fVar43;
    (pIVar20->IO).MouseReleased[lVar36] = false;
    if (bVar40 == false) {
      if (bVar23 != false) {
        bVar23 = IsMousePosValid(pIVar9);
        auVar53 = ZEXT816(0);
        if (bVar23) {
          IVar46 = (pIVar20->IO).MousePos;
          uVar10 = *(undefined8 *)((long)(pIVar20->IO).MouseClickedTime + lVar36 * 8 + -4);
          auVar53._0_4_ = IVar46.x - (float)uVar10;
          auVar53._4_4_ = IVar46.y - (float)((ulong)uVar10 >> 0x20);
          auVar53._8_8_ = 0;
        }
        fVar43 = (pIVar20->IO).KeysDownDuration[lVar36];
        fVar44 = auVar53._0_4_ * auVar53._0_4_ + auVar53._4_4_ * auVar53._4_4_;
        uVar42 = -(uint)(fVar44 <= fVar43);
        (pIVar20->IO).KeysDownDuration[lVar36] =
             (float)(~uVar42 & (uint)fVar44 | (uint)fVar43 & uVar42);
        uVar10 = *(undefined8 *)((pIVar20->IO).MouseDragMaxDistanceSqr + lVar36 * 2);
        auVar62._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
        auVar62._8_4_ = auVar53._8_4_ ^ 0x80000000;
        auVar62._12_4_ = auVar53._12_4_ ^ 0x80000000;
        auVar59 = maxps(auVar62,auVar53);
        fVar43 = (float)uVar10;
        fVar44 = (float)((ulong)uVar10 >> 0x20);
        uVar42 = -(uint)(auVar59._0_4_ <= fVar43);
        uVar29 = -(uint)(auVar59._4_4_ <= fVar44);
        *(ulong *)((pIVar20->IO).MouseDragMaxDistanceSqr + lVar36 * 2) =
             CONCAT44(~uVar29 & (uint)auVar59._4_4_,~uVar42 & (uint)auVar59._0_4_) |
             CONCAT44((uint)fVar44 & uVar29,(uint)fVar43 & uVar42);
      }
    }
    else {
      dVar51 = pIVar20->Time;
      if ((float)(dVar51 - *(double *)((pIVar20->IO).MouseClicked + lVar36 * 8)) <
          (pIVar20->IO).MouseDoubleClickTime) {
        bVar23 = IsMousePosValid(pIVar9);
        fVar43 = 0.0;
        fVar44 = 0.0;
        if (bVar23) {
          IVar46 = (pIVar20->IO).MousePos;
          uVar10 = *(undefined8 *)((long)(pIVar20->IO).MouseClickedTime + lVar36 * 8 + -4);
          fVar43 = IVar46.x - (float)uVar10;
          fVar44 = IVar46.y - (float)((ulong)uVar10 >> 0x20);
        }
        fVar45 = (pIVar20->IO).MouseDoubleClickMaxDist;
        if (fVar43 * fVar43 + fVar44 * fVar44 < fVar45 * fVar45) {
          (pIVar20->IO).MouseReleased[lVar36] = true;
        }
        dVar51 = (double)((pIVar20->IO).MouseDoubleClickTime * -2.0);
      }
      *(double *)((pIVar20->IO).MouseClicked + lVar36 * 8) = dVar51;
      *(ImVec2 *)((long)(pIVar20->IO).MouseClickedTime + lVar36 * 8 + -4) = (pIVar20->IO).MousePos;
      *(bool *)((long)(pIVar20->IO).MouseDownDuration + lVar36 + -3) =
           (pIVar20->IO).MouseReleased[lVar36];
      pfVar4 = (pIVar20->IO).MouseDragMaxDistanceSqr + lVar36 * 2;
      pfVar4[0] = 0.0;
      pfVar4[1] = 0.0;
      (pIVar20->IO).KeysDownDuration[lVar36] = 0.0;
    }
    if (((pIVar20->IO).MouseDown[lVar36 + 5] == false) &&
       ((pIVar20->IO).MouseDownOwned[lVar36] == false)) {
      *(undefined1 *)((long)(pIVar20->IO).MouseDownDuration + lVar36 + -3) = 0;
    }
    if ((pIVar20->IO).MouseDoubleClicked[lVar36] == true) {
      pIVar20->NavDisableMouseHover = false;
    }
    lVar36 = lVar36 + 1;
  } while (lVar36 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar27 = GetTopMostPopupModal();
  if ((pIVar27 != (ImGuiWindow *)0x0) ||
     ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar19->NavWindowingHighlightAlpha)))) {
    fVar43 = (pIVar19->IO).DeltaTime * 6.0 + pIVar19->DimBgRatio;
    if (1.0 <= fVar43) {
      fVar43 = 1.0;
    }
    pIVar19->DimBgRatio = fVar43;
  }
  else {
    fVar43 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->DimBgRatio;
    pIVar19->DimBgRatio = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
  }
  pIVar19->MouseCursor = 0;
  pIVar19->WantTextInputNextFrame = -1;
  pIVar19->WantCaptureMouseNextFrame = -1;
  pIVar19->WantCaptureKeyboardNextFrame = -1;
  (pIVar19->PlatformImePos).x = 1.0;
  pIVar20 = GImGui;
  (pIVar19->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar23 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar23) &&
       (fVar43 = (pIVar20->IO).MouseDragThreshold,
       fVar44 = (pIVar20->IO).MousePos.x - (pIVar20->WheelingWindowRefMousePos).x,
       fVar45 = (pIVar20->IO).MousePos.y - (pIVar20->WheelingWindowRefMousePos).y,
       fVar43 * fVar43 < fVar44 * fVar44 + fVar45 * fVar45)) {
      pIVar20->WheelingWindowTimer = 0.0;
    }
    if (pIVar20->WheelingWindowTimer <= 0.0) {
      pIVar20->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar20->WheelingWindowTimer = 0.0;
    }
  }
  pIVar21 = GImGui;
  fVar43 = (pIVar20->IO).MouseWheel;
  if (((fVar43 != 0.0) || (fVar44 = (pIVar20->IO).MouseWheelH, fVar44 != 0.0)) || (NAN(fVar44))) {
    pIVar27 = pIVar20->WheelingWindow;
    if (pIVar27 == (ImGuiWindow *)0x0) {
      pIVar27 = pIVar20->HoveredWindow;
    }
    if ((pIVar27 != (ImGuiWindow *)0x0) && (pIVar27->Collapsed == false)) {
      fVar44 = 0.0;
      if ((fVar43 != 0.0) || (NAN(fVar43))) {
        if (((pIVar20->IO).KeyCtrl == true) && ((pIVar20->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar27) {
            GImGui->WheelingWindow = pIVar27;
            pIVar21->WheelingWindowRefMousePos = (pIVar21->IO).MousePos;
            pIVar21->WheelingWindowTimer = 2.0;
          }
          fVar43 = pIVar27->FontWindowScale;
          fVar45 = (pIVar20->IO).MouseWheel * 0.1 + fVar43;
          fVar44 = 2.5;
          if (fVar45 <= 2.5) {
            fVar44 = fVar45;
          }
          fVar44 = (float)(-(uint)(fVar45 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar45 < 0.5) & (uint)fVar44);
          pIVar27->FontWindowScale = fVar44;
          if ((pIVar27->Flags & 0x1000000) == 0) {
            fVar44 = fVar44 / fVar43;
            IVar46 = pIVar27->Size;
            auVar60._8_8_ = 0;
            auVar60._0_4_ = IVar46.x;
            auVar60._4_4_ = IVar46.y;
            IVar56 = (pIVar20->IO).MousePos;
            fVar43 = (pIVar27->Pos).x;
            fVar45 = (pIVar27->Pos).y;
            auVar63._0_4_ = (IVar56.x - fVar43) * (1.0 - fVar44) * IVar46.x;
            auVar63._4_4_ = (IVar56.y - fVar45) * (1.0 - fVar44) * IVar46.y;
            auVar63._8_8_ = 0;
            auVar59 = divps(auVar63,auVar60);
            local_40.Min.x = auVar59._0_4_ + fVar43;
            local_40.Min.y = auVar59._4_4_ + fVar45;
            SetWindowPos(pIVar27,&local_40.Min,0);
            IVar52.x = (float)(int)((pIVar27->Size).x * fVar44);
            IVar52.y = (float)(int)((pIVar27->Size).y * fVar44);
            IVar58.x = (float)(int)((pIVar27->SizeFull).x * fVar44);
            IVar58.y = (float)(int)((pIVar27->SizeFull).y * fVar44);
            pIVar27->Size = IVar52;
            pIVar27->SizeFull = IVar58;
          }
          goto LAB_0020655e;
        }
        if ((pIVar20->IO).KeyShift == false) {
          fVar44 = fVar43;
        }
      }
      if (((fVar44 != 0.0) || (NAN(fVar44))) && ((pIVar20->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar27) {
          GImGui->WheelingWindow = pIVar27;
          pIVar21->WheelingWindowRefMousePos = (pIVar21->IO).MousePos;
          pIVar21->WheelingWindowTimer = 2.0;
        }
        uVar42 = pIVar27->Flags;
        while (((uVar42 >> 0x18 & 1) != 0 &&
               (((uVar42 & 0x210) == 0x10 ||
                ((fVar43 = (pIVar27->ScrollMax).y, fVar43 == 0.0 && (!NAN(fVar43)))))))) {
          pIVar27 = pIVar27->ParentWindow;
          uVar42 = pIVar27->Flags;
        }
        if ((uVar42 & 0x210) == 0) {
          fVar43 = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) * 0.67;
          fVar45 = pIVar21->FontBaseSize * pIVar27->FontWindowScale;
          if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
            fVar45 = fVar45 * pIVar27->ParentWindow->FontWindowScale;
          }
          fVar54 = fVar45 * 5.0;
          if (fVar43 <= fVar45 * 5.0) {
            fVar54 = fVar43;
          }
          (pIVar27->ScrollTarget).y = (pIVar27->Scroll).y - fVar44 * (float)(int)fVar54;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      pIVar21 = GImGui;
      fVar43 = (pIVar20->IO).MouseWheelH;
      if (((fVar43 == 0.0) && (!NAN(fVar43))) || ((pIVar20->IO).KeyShift == true)) {
        fVar44 = (pIVar20->IO).MouseWheel;
        if ((fVar44 != 0.0) || (NAN(fVar44))) {
          fVar43 = 0.0;
          if ((pIVar20->IO).KeyShift == true) {
            fVar43 = fVar44;
          }
        }
        else {
          fVar43 = 0.0;
        }
      }
      if (((fVar43 != 0.0) || (NAN(fVar43))) && ((pIVar20->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar27) {
          GImGui->WheelingWindow = pIVar27;
          pIVar21->WheelingWindowRefMousePos = (pIVar21->IO).MousePos;
          pIVar21->WheelingWindowTimer = 2.0;
        }
        while ((uVar42 = pIVar27->Flags, (uVar42 >> 0x18 & 1) != 0 &&
               (((uVar42 & 0x210) == 0x10 ||
                ((fVar44 = (pIVar27->ScrollMax).x, fVar44 == 0.0 && (!NAN(fVar44)))))))) {
          pIVar27 = pIVar27->ParentWindow;
        }
        if ((uVar42 & 0x210) == 0) {
          fVar44 = ((pIVar27->InnerRect).Max.x - (pIVar27->InnerRect).Min.x) * 0.67;
          fVar45 = pIVar21->FontBaseSize * pIVar27->FontWindowScale;
          if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
            fVar45 = fVar45 * pIVar27->ParentWindow->FontWindowScale;
          }
          fVar54 = fVar45 + fVar45;
          if (fVar44 <= fVar45 + fVar45) {
            fVar54 = fVar44;
          }
          (pIVar27->ScrollTarget).x = (pIVar27->Scroll).x - fVar43 * (float)(int)fVar54;
          (pIVar27->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_0020655e:
  pIVar20 = GImGui;
  pIVar27 = GImGui->NavWindow;
  if (((pIVar27 == (ImGuiWindow *)0x0) || (pIVar27->Active != true)) ||
     (((pIVar27->Flags & 0x40000) != 0 ||
      (((GImGui->IO).KeyCtrl != false || (iVar26 = (GImGui->IO).KeyMap[0], iVar26 < 0)))))) {
    bVar23 = false;
  }
  else {
    bVar23 = IsKeyPressed(iVar26,true);
  }
  pIVar20->FocusTabPressed = bVar23;
  if ((bVar23 != false) && (pIVar20->ActiveId == 0)) {
    pIVar20->FocusRequestNextWindow = pIVar20->NavWindow;
    pIVar20->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar20->NavId == 0) || (pIVar20->NavIdTabCounter == 0x7fffffff)) {
      iVar26 = -(uint)(pIVar20->IO).KeyShift;
    }
    else {
      iVar26 = pIVar20->NavIdTabCounter + (-(uint)(pIVar20->IO).KeyShift | 1) + 1;
    }
    pIVar20->FocusRequestNextCounterTabStop = iVar26;
  }
  pIVar20->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar20->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar20->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar27 = pIVar20->FocusRequestNextWindow;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar20->FocusRequestCurrWindow = pIVar27;
    if ((pIVar20->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar26 = (pIVar27->DC).FocusCounterRegular, iVar26 != -1)) {
      pIVar20->FocusRequestCurrCounterRegular =
           (pIVar20->FocusRequestNextCounterRegular + iVar26 + 1) % (iVar26 + 1);
    }
    if ((pIVar20->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar26 = (pIVar27->DC).FocusCounterTabStop, iVar26 != -1)) {
      pIVar20->FocusRequestCurrCounterTabStop =
           (pIVar20->FocusRequestNextCounterTabStop + iVar26 + 1) % (iVar26 + 1);
    }
    pIVar20->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar20->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar20->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar20->NavIdTabCounter = 0x7fffffff;
  if ((pIVar19->WindowsFocusOrder).Size != (pIVar19->Windows).Size) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xeff,"NewFrame","ImGui ASSERT FAILED: %s",
                "g.WindowsFocusOrder.Size == g.Windows.Size");
  }
  local_68 = (pIVar19->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= local_68) {
    local_68 = (float)pIVar19->Time - local_68;
  }
  else {
    local_68 = 3.4028235e+38;
  }
  uVar42 = (pIVar19->Windows).Size;
  uVar28 = (ulong)uVar42;
  if (uVar42 != 0) {
    uVar37 = 0;
    do {
      if ((long)(int)uVar28 <= (long)uVar37) {
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                    ,0x604,"operator[]","ImGui ASSERT FAILED: %s","i < Size");
      }
      pIVar27 = (pIVar19->Windows).Data[uVar37];
      bVar23 = pIVar27->Active;
      pIVar27->WasActive = bVar23;
      pIVar27->BeginCount = 0;
      pIVar27->Active = false;
      pIVar27->WriteAccessed = false;
      if (((bVar23 == false) && (pIVar27->MemoryCompacted == false)) &&
         (pIVar27->LastTimeActive <= local_68 && local_68 != pIVar27->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar27);
      }
      uVar37 = uVar37 + 1;
      uVar28 = (ulong)(uint)(pIVar19->Windows).Size;
    } while (uVar37 != uVar28);
  }
  if ((pIVar19->NavWindow != (ImGuiWindow *)0x0) && (pIVar19->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar26 = (pIVar19->CurrentWindowStack).Capacity;
  if (iVar26 < 0) {
    uVar42 = iVar26 / 2 + iVar26;
    uVar28 = 0;
    if (0 < (int)uVar42) {
      uVar28 = (ulong)uVar42;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar28 * 8,GImAllocatorUserData);
    ppIVar17 = (pIVar19->CurrentWindowStack).Data;
    if (ppIVar17 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar17,(long)(pIVar19->CurrentWindowStack).Size << 3);
      ppIVar17 = (pIVar19->CurrentWindowStack).Data;
      if ((ppIVar17 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar17,GImAllocatorUserData);
    }
    (pIVar19->CurrentWindowStack).Data = __dest_00;
    (pIVar19->CurrentWindowStack).Capacity = (int)uVar28;
  }
  (pIVar19->CurrentWindowStack).Size = 0;
  iVar26 = (pIVar19->BeginPopupStack).Capacity;
  if (iVar26 < 0) {
    uVar42 = iVar26 / 2 + iVar26;
    uVar28 = 0;
    if (0 < (int)uVar42) {
      uVar28 = (ulong)uVar42;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar28 * 0x30,GImAllocatorUserData);
    pIVar18 = (pIVar19->BeginPopupStack).Data;
    if (pIVar18 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar18,(long)(pIVar19->BeginPopupStack).Size * 0x30);
      pIVar18 = (pIVar19->BeginPopupStack).Data;
      if ((pIVar18 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar19->BeginPopupStack).Data = __dest_01;
    (pIVar19->BeginPopupStack).Capacity = (int)uVar28;
  }
  (pIVar19->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar19->NavWindow,false);
  pIVar20 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar20->DebugItemPickerActive == true) {
    uVar42 = pIVar20->HoveredIdPreviousFrame;
    pIVar20->MouseCursor = 7;
    iVar26 = (pIVar20->IO).KeyMap[0xe];
    if ((-1 < iVar26) && (bVar23 = IsKeyPressed(iVar26,true), bVar23)) {
      pIVar20->DebugItemPickerActive = false;
    }
    pIVar21 = GImGui;
    if (uVar42 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar20->DebugItemPickerBreakId = uVar42;
      pIVar20->DebugItemPickerActive = false;
    }
    pIVar6 = &pIVar21->NextWindowData;
    *(byte *)&pIVar6->Flags = (byte)pIVar6->Flags | 0x40;
    (pIVar21->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar42);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar42 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar19->WithinFrameScopeWithImplicitWindow = true;
  pIVar20 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar20->NextWindowData).SizeVal.x = 400.0;
  (pIVar20->NextWindowData).SizeVal.y = 400.0;
  (pIVar20->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar19->CurrentWindow->IsFallbackWindow == false) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0xf21,"NewFrame","ImGui ASSERT FAILED: %s",
                "g.CurrentWindow->IsFallbackWindow == true");
    return;
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}